

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::ArrayBuilder<capnp::compiler::NodeTranslator::BrandScope_*>::dispose
          (ArrayBuilder<capnp::compiler::NodeTranslator::BrandScope_*> *this)

{
  BrandScope **ppBVar1;
  RemoveConst<capnp::compiler::NodeTranslator::BrandScope_*> *ppBVar2;
  BrandScope **ppBVar3;
  
  ppBVar1 = this->ptr;
  if (ppBVar1 != (BrandScope **)0x0) {
    ppBVar2 = this->pos;
    ppBVar3 = this->endPtr;
    this->endPtr = (BrandScope **)0x0;
    this->ptr = (BrandScope **)0x0;
    this->pos = (RemoveConst<capnp::compiler::NodeTranslator::BrandScope_*> *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,ppBVar1,8,(long)ppBVar2 - (long)ppBVar1 >> 3,
               (long)ppBVar3 - (long)ppBVar1 >> 3,0);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }